

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ping_pong.c
# Opt level: O3

cio_error setup_client(client *client,cio_io_stream *stream)

{
  cio_error cVar1;
  
  cVar1 = cio_buffered_stream_init(&client1.bs,(cio_io_stream *)client);
  if (cVar1 != CIO_SUCCESS) {
    setup_client_cold_1();
  }
  else {
    client1.rb.data = client1.buffer;
    client1.rb.end = (uint8_t *)&client2;
    client1.rb.fetch_ptr = client1.buffer;
    client1.rb.add_ptr = client1.buffer;
  }
  return (uint)(cVar1 != CIO_SUCCESS);
}

Assistant:

static enum cio_error setup_client(struct client *client, struct cio_io_stream *stream)
{
	enum cio_error err = cio_buffered_stream_init(&client->bs, stream);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "failed to init buffered stream!\n");
		return EXIT_FAILURE;
	}
	err = cio_read_buffer_init(&client->rb, client->buffer, sizeof(client->buffer));
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "failed to init read buffer!\n");
		return EXIT_FAILURE;
	}

	return CIO_SUCCESS;
}